

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O3

ostream * std::operator<<(ostream *os,vector<unsigned_long,_std::allocator<unsigned_long>_> *vec)

{
  pointer puVar1;
  ostream *poVar2;
  unsigned_long *item;
  pointer puVar3;
  
  puVar1 = (vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const std::vector<T>& vec)
{
  for (auto const& item : vec)
  {
    os << item << ", ";
  }
  return os;
}